

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

LibraryPtr __thiscall Jinx::Impl::Runtime::GetLibrary(Runtime *this,String *name)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  iterator iVar4;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  LibraryPtr LVar5;
  shared_ptr<Jinx::Impl::Library> library;
  undefined1 local_69;
  shared_ptr<Jinx::Impl::Library> local_68;
  undefined1 local_58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&name[0x81].field_2);
  if (iVar3 == 0) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
                    *)(name[0x82].field_2._M_local_buf + 8),in_RDX);
    if (iVar4._M_node == (_Base_ptr)&name[0x83]._M_string_length) {
      std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Jinx::Impl::Runtime,void>
                ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)local_58,
                 (__weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)
                 &name->_M_string_length);
      local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Jinx::Impl::Library,Jinx::Allocator<Jinx::Impl::Library>,std::shared_ptr<Jinx::Impl::Runtime>,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&>
                (&local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Library **)&local_68,(Allocator<Jinx::Impl::Library> *)&local_69,
                 (shared_ptr<Jinx::Impl::Runtime> *)local_58,in_RDX);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
      ::pair<std::shared_ptr<Jinx::Impl::Library>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
                  *)local_58,in_RDX,&local_68);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,4096ul,16ul>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::shared_ptr<Jinx::Impl::Library>>>
                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,4096ul,16ul>>
                  *)(name[0x82].field_2._M_local_buf + 8),
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
                  *)local_58);
      if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
      }
      if ((element_type *)local_58._0_8_ != (element_type *)(local_58 + 0x10)) {
        MemFree((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
      _Var2._M_pi = local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      (this->super_IRuntime)._vptr_IRuntime =
           (_func_int **)
           local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      local_68.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var2._M_pi;
    }
    else {
      (this->super_IRuntime)._vptr_IRuntime = *(_func_int ***)(iVar4._M_node + 2);
      peVar1 = (element_type *)iVar4._M_node[2]._M_parent;
      (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
      super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      if (peVar1 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                   super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                   super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
                        super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&name[0x81].field_2);
    LVar5.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    LVar5.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (LibraryPtr)LVar5.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

inline_t LibraryPtr Runtime::GetLibrary(const String & name)
	{
		std::lock_guard<std::mutex> lock(m_libraryMutex);
		auto itr = m_libraryMap.find(name);
		if (itr == m_libraryMap.end())
		{
			auto library = std::allocate_shared<Library>(Allocator<Library>(), shared_from_this(), name);
			m_libraryMap.insert(std::make_pair(name, library));
			return library;
		}
		return itr->second;
	}